

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O3

bool __thiscall RTIMULSM9DS1::IMURead(RTIMULSM9DS1 *this)

{
  bool bVar1;
  uint64_t uVar2;
  uchar regAddr;
  long lVar3;
  uchar status;
  uchar compassData [6];
  uchar accelData [6];
  uchar gyroData [6];
  byte local_43;
  uchar local_42 [6];
  uchar local_3c [6];
  uchar local_36 [6];
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelGyroSlaveAddr,'\x17','\x01',&local_43,
                            "Failed to read LSM9DS1 status");
  if ((bVar1) && ((local_43 & 3) != 0)) {
    lVar3 = 0;
    do {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_accelGyroSlaveAddr,(char)lVar3 + '\x18','\x01',
                                local_36 + lVar3,"Failed to read LSM9DS1 gyro data");
      if (!bVar1) goto LAB_0011a8d5;
      regAddr = (char)lVar3 + '(';
      bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_accelGyroSlaveAddr,regAddr,'\x01',local_3c + lVar3,
                                "Failed to read LSM9DS1 accel data");
      if (!bVar1) goto LAB_0011a8d5;
      bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_magSlaveAddr,regAddr,'\x01',local_42 + lVar3,
                                "Failed to read LSM9DS1 compass data");
      if (!bVar1) goto LAB_0011a8d5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    uVar2 = RTMath::currentUSecsSinceEpoch();
    (this->super_RTIMU).m_imuData.timestamp = uVar2;
    RTMath::convertToVector(local_36,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
    RTMath::convertToVector(local_3c,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
    RTMath::convertToVector
              (local_42,&(this->super_RTIMU).m_imuData.compass,this->m_compassScale,false);
    (this->super_RTIMU).m_imuData.gyro.m_data[2] = -(this->super_RTIMU).m_imuData.gyro.m_data[2];
    *(ulong *)(this->super_RTIMU).m_imuData.accel.m_data =
         *(ulong *)(this->super_RTIMU).m_imuData.accel.m_data ^ 0x8000000080000000;
    (this->super_RTIMU).m_imuData.compass.m_data[0] =
         -(this->super_RTIMU).m_imuData.compass.m_data[0];
    (this->super_RTIMU).m_imuData.compass.m_data[2] =
         -(this->super_RTIMU).m_imuData.compass.m_data[2];
    RTIMU::handleGyroBias(&this->super_RTIMU);
    RTIMU::calibrateAverageCompass(&this->super_RTIMU);
    RTIMU::calibrateAccel(&this->super_RTIMU);
    RTIMU::updateFusion(&this->super_RTIMU);
    bVar1 = true;
  }
  else {
LAB_0011a8d5:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RTIMULSM9DS1::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char compassData[6];

    if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_STATUS, 1, &status, "Failed to read LSM9DS1 status"))
        return false;

    if ((status & 0x3) == 0)
        return false;

    for (int i = 0; i<6; i++){
        if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_OUT_X_L_G + i, 1, &gyroData[i], "Failed to read LSM9DS1 gyro data"))
            return false;

        if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_OUT_X_L_XL + i, 1, &accelData[i], "Failed to read LSM9DS1 accel data"))
            return false;

        if (!m_settings->HALRead(m_magSlaveAddr, LSM9DS1_MAG_OUT_X_L + i, 1, &compassData[i], "Failed to read LSM9DS1 compass data"))
            return false;
    }


    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);
    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);
    RTMath::convertToVector(compassData, m_imuData.compass, m_compassScale, false);

    //  sort out gyro axes and correct for bias

    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());
    m_imuData.accel.setY(-m_imuData.accel.y());

    //  sort out compass axes

    m_imuData.compass.setX(-m_imuData.compass.x());
    m_imuData.compass.setZ(-m_imuData.compass.z());

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    //  now update the filter

    updateFusion();

    return true;
}